

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_init(curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  curl_hash_dtor dtor)

{
  curl_llist **ppcVar1;
  curl_llist *pcVar2;
  long lVar3;
  
  if ((dtor == (curl_hash_dtor)0x0 || comparator == (comp_function)0x0) ||
      (hfunc == (hash_function)0x0 || slots == 0)) {
    return 1;
  }
  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;
  ppcVar1 = (curl_llist **)(*Curl_cmalloc)((long)slots << 3);
  h->table = ppcVar1;
  if (ppcVar1 != (curl_llist **)0x0) {
    if (0 < slots) {
      lVar3 = 0;
      do {
        pcVar2 = Curl_llist_alloc(hash_element_dtor);
        *(curl_llist **)((long)h->table + lVar3) = pcVar2;
        if (*(long *)((long)h->table + lVar3) == 0) goto joined_r0x0048805b;
        lVar3 = lVar3 + 8;
      } while ((ulong)(uint)slots << 3 != lVar3);
    }
    return 0;
  }
LAB_00488091:
  h->slots = 0;
  return 1;
joined_r0x0048805b:
  for (; lVar3 != 0; lVar3 = lVar3 + -8) {
    Curl_llist_destroy(*(curl_llist **)((long)h->table + lVar3 + -8),(void *)0x0);
    *(undefined8 *)((long)h->table + lVar3 + -8) = 0;
  }
  (*Curl_cfree)(h->table);
  h->table = (curl_llist **)0x0;
  goto LAB_00488091;
}

Assistant:

int
Curl_hash_init(struct curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               curl_hash_dtor dtor)
{
  int i;

  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct curl_llist *));
  if(h->table) {
    for(i = 0; i < slots; ++i) {
      h->table[i] = Curl_llist_alloc((curl_llist_dtor) hash_element_dtor);
      if(!h->table[i]) {
        while(i--) {
          Curl_llist_destroy(h->table[i], NULL);
          h->table[i] = NULL;
        }
        free(h->table);
        h->table = NULL;
        h->slots = 0;
        return 1; /* failure */
      }
    }
    return 0; /* fine */
  }
  else {
    h->slots = 0;
    return 1; /* failure */
  }
}